

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avCodecs.h
# Opt level: O2

void __thiscall CheckStreamRez::CheckStreamRez(CheckStreamRez *this)

{
  (this->codecInfo).codecID = 0;
  (this->codecInfo).displayName._M_dataplus._M_p = (pointer)&(this->codecInfo).displayName.field_2;
  (this->codecInfo).displayName._M_string_length = 0;
  (this->codecInfo).displayName.field_2._M_local_buf[0] = '\0';
  (this->codecInfo).programName._M_dataplus._M_p = (pointer)&(this->codecInfo).programName.field_2;
  (this->codecInfo).programName._M_string_length = 0;
  (this->codecInfo).programName.field_2._M_local_buf[0] = '\0';
  (this->streamDescr)._M_dataplus._M_p = (pointer)&(this->streamDescr).field_2;
  (this->streamDescr)._M_string_length = 0;
  (this->streamDescr).field_2._M_local_buf[0] = '\0';
  (this->lang)._M_dataplus._M_p = (pointer)&(this->lang).field_2;
  (this->lang)._M_string_length = 0;
  (this->lang).field_2._M_local_buf[0] = '\0';
  this->trackID = 0;
  this->delay = 0;
  *(undefined4 *)((long)&this->delay + 7) = 0;
  return;
}

Assistant:

CodecInfo() : codecID(0) {}